

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

void __thiscall Fl_Window_Type::draw_overlay(Fl_Window_Type *this)

{
  int iVar1;
  int iVar2;
  Fl_Type *pFVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Fl_Widget *pFVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  Fl_Widget_Type *myo;
  Fl_Widget_Type *pFVar17;
  uint uVar18;
  uint uVar19;
  Fl_Type *pFVar20;
  Fl_Widget_Type *pFVar21;
  int iVar22;
  int iVar23;
  int y;
  int t;
  int xsp;
  int ww_1;
  int hh;
  int ww;
  int ih;
  int iw;
  ulong local_c0;
  ulong local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  Fl_Widget_Type *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  int local_5c;
  uint local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  Fl_Window_Type *local_40;
  int local_38;
  int local_34;
  
  if (this->recalc != 0) {
    pFVar20 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
    pFVar12 = (this->super_Fl_Widget_Type).o;
    iVar4 = pFVar12->h_;
    iVar1 = pFVar12->w_;
    iVar2 = pFVar12->h_;
    iVar22 = 0;
    iVar23 = 0;
    this->bx = pFVar12->w_;
    this->by = iVar4;
    this->br = 0;
    this->bt = 0;
    this->numselected = 0;
    if (pFVar20 != (Fl_Type *)0x0) {
      do {
        if (pFVar20->level <= (this->super_Fl_Widget_Type).super_Fl_Type.level) break;
        if (((pFVar20->selected != '\0') &&
            (iVar1 = (*pFVar20->_vptr_Fl_Type[0x17])(pFVar20), iVar1 != 0)) &&
           (iVar1 = (*pFVar20->_vptr_Fl_Type[0x1e])(pFVar20), iVar1 == 0)) {
          this->numselected = this->numselected + 1;
          pFVar3 = pFVar20[1].prev;
          iVar1 = *(int *)&pFVar3->user_data_;
          if (iVar1 < this->bx) {
            this->bx = iVar1;
          }
          iVar2 = *(int *)((long)&pFVar3->user_data_ + 4);
          if (iVar2 < this->by) {
            this->by = iVar2;
          }
          iVar1 = iVar1 + *(int *)&pFVar3->user_data_type_;
          if (this->br < iVar1) {
            this->br = iVar1;
          }
          iVar2 = iVar2 + *(int *)((long)&pFVar3->user_data_type_ + 4);
          if (this->bt < iVar2) {
            this->bt = iVar2;
          }
        }
        pFVar20 = pFVar20->next;
      } while (pFVar20 != (Fl_Type *)0x0);
      iVar1 = this->bx;
      iVar2 = this->by;
      iVar22 = this->br;
      iVar23 = this->bt;
    }
    this->recalc = 0;
    this->sx = iVar1;
    this->sy = iVar2;
    this->sr = iVar22;
    this->st = iVar23;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x58);
  iVar1 = this->drag;
  if (iVar1 == 0x20) {
    uVar11 = this->x1;
    uVar9 = this->mx;
    uVar16 = this->my;
    uVar10 = this->y1;
    if (uVar10 != uVar16 || uVar11 != uVar9) {
      uVar19 = uVar9;
      if ((int)uVar11 < (int)uVar9) {
        uVar19 = uVar11;
      }
      uVar13 = uVar16;
      if ((int)uVar10 < (int)uVar16) {
        uVar13 = uVar10;
      }
      lVar15 = (long)(int)uVar11 - (long)(int)uVar9;
      lVar8 = -lVar15;
      if (0 < lVar15) {
        lVar8 = lVar15;
      }
      lVar5 = (long)(int)uVar10 - (long)(int)uVar16;
      lVar15 = -lVar5;
      if (0 < lVar5) {
        lVar15 = lVar5;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
                (fl_graphics_driver,(ulong)uVar19,(ulong)uVar13,lVar8,lVar15);
      iVar1 = this->drag;
      goto LAB_0018b760;
    }
  }
  else {
LAB_0018b760:
    if ((overlays_invisible != 0) && (iVar1 == 0)) {
      return;
    }
  }
  if ((this->super_Fl_Widget_Type).super_Fl_Type.selected != '\0') {
    pFVar12 = (this->super_Fl_Widget_Type).o;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
              (fl_graphics_driver,0,0,(ulong)(uint)pFVar12->w_,(ulong)(uint)pFVar12->h_);
  }
  if (this->numselected == 0) {
    return;
  }
  pFVar17 = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
  pFVar12 = (this->super_Fl_Widget_Type).o;
  uVar11 = pFVar12->w_;
  uVar9 = pFVar12->h_;
  local_8c = uVar9;
  local_40 = this;
  if (pFVar17 == (Fl_Widget_Type *)0x0) {
    local_48 = 0;
    local_74 = 0;
    pFVar21 = (Fl_Widget_Type *)0x0;
    uVar16 = 0;
    local_68 = 0;
    local_50 = (ulong)uVar11;
  }
  else {
    local_68 = 0;
    local_50 = (ulong)uVar11;
    uVar16 = 0;
    pFVar21 = (Fl_Widget_Type *)0x0;
    local_74 = 0;
    local_48 = 0;
    do {
      if ((pFVar17->super_Fl_Type).level <= (this->super_Fl_Widget_Type).super_Fl_Type.level) break;
      if ((((pFVar17->super_Fl_Type).selected != '\0') &&
          (iVar1 = (*(pFVar17->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar17), iVar1 != 0)) &&
         (iVar1 = (*(pFVar17->super_Fl_Type)._vptr_Fl_Type[0x1e])(pFVar17), iVar1 == 0)) {
        local_98 = uVar9;
        newposition(this,pFVar17,(int *)&local_90,(int *)&local_9c,(int *)&local_78,(int *)&local_94
                   );
        uVar18 = local_78;
        uVar13 = local_90;
        uVar19 = local_94;
        uVar10 = local_9c;
        if (((show_guides == 0) || (this->drag == 0)) || (this->numselected != 1)) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
                    (fl_graphics_driver,(ulong)local_90,(ulong)local_9c,(ulong)(local_78 - local_90)
                     ,(ulong)(local_94 - local_9c));
        }
        local_7c = uVar11;
        if ((int)uVar13 < (int)uVar11) {
          local_7c = uVar13;
        }
        uVar9 = local_98;
        if ((int)uVar10 < (int)local_98) {
          uVar9 = uVar10;
        }
        iVar1 = (int)local_48;
        local_48 = local_48 & 0xffffffff;
        if (iVar1 < (int)uVar18) {
          local_48 = (ulong)uVar18;
        }
        if ((int)local_74 < (int)uVar19) {
          local_74 = uVar19;
        }
        pFVar12 = pFVar17->o;
        uVar11 = (pFVar12->label_).align_;
        if ((uVar11 & 0x10) == 0) {
          local_6c = 0;
          if ((char)uVar11 < '\0') {
            local_6c = pFVar12->w_;
          }
          local_70 = (pFVar12->label_).size;
          Fl_Label::measure(&pFVar12->label_,&local_6c,&local_70);
          uVar11 = (pFVar17->o->label_).align_;
          if ((uVar11 & 1) == 0) {
            if ((uVar11 & 2) == 0) {
              if ((uVar11 & 4) == 0) {
                if ((uVar11 & 8) != 0) {
                  uVar18 = uVar18 + local_6c + 4;
                }
              }
              else {
                uVar13 = (uVar13 - local_6c) - 4;
              }
            }
            else {
              uVar19 = uVar19 + local_70;
              local_94 = uVar19;
            }
          }
          else {
            uVar10 = uVar10 - local_70;
            local_9c = uVar10;
          }
        }
        iVar1 = (int)local_50;
        local_50 = local_50 & 0xffffffff;
        if ((int)uVar13 < iVar1) {
          local_50 = (ulong)uVar13;
        }
        if ((int)uVar10 < (int)local_8c) {
          local_8c = uVar10;
        }
        iVar1 = (int)local_68;
        local_68 = local_68 & 0xffffffff;
        if (iVar1 < (int)uVar18) {
          local_68 = (ulong)uVar18;
        }
        pFVar21 = pFVar17;
        this = local_40;
        uVar11 = local_7c;
        if ((int)uVar16 < (int)uVar19) {
          uVar16 = uVar19;
        }
      }
      pFVar17 = (Fl_Widget_Type *)(pFVar17->super_Fl_Type).next;
    } while (pFVar17 != (Fl_Widget_Type *)0x0);
  }
  if ((this->super_Fl_Widget_Type).super_Fl_Type.selected != '\0') {
    return;
  }
  local_88 = pFVar21;
  if ((show_guides == 0) || (this->drag == 0)) {
    local_c0._0_4_ = (int)local_48;
    uVar16 = local_74;
    goto LAB_0018c643;
  }
  local_7c = uVar11;
  (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x2e])(this,&local_90,&local_9c);
  local_a8 = local_50;
  uVar13 = local_9c;
  uVar11 = this->drag;
  uVar10 = local_8c;
  uVar19 = uVar16;
  if (uVar11 == 0) {
    uVar11 = 0;
    local_c0 = local_68;
    local_a8 = local_50 & 0xffffffff;
  }
  else {
    uVar6 = local_8c - local_9c;
    uVar18 = -uVar6;
    if (0 < (int)uVar6) {
      uVar18 = uVar6;
    }
    iVar1 = (int)local_50;
    if (uVar18 < 3) {
      this->dy = this->dy - uVar6;
      iVar2 = uVar11 << 0x1b;
      draw_v_arrow(iVar1 + 5,local_9c,0);
      uVar11 = this->drag;
      uVar10 = uVar13;
      uVar19 = uVar16 - (iVar2 >> 0x1f & uVar6);
    }
    iVar2 = ((this->super_Fl_Widget_Type).o)->h_;
    uVar18 = iVar2 - (local_9c + uVar19);
    uVar13 = -uVar18;
    if (0 < (int)uVar18) {
      uVar13 = uVar18;
    }
    if (uVar13 < 3) {
      this->dy = this->dy + uVar18;
      uVar10 = ((int)(uVar11 << 0x1b) >> 0x1f & uVar18) + uVar10;
      uVar19 = uVar19 + uVar18;
      draw_v_arrow(iVar1 + 5,uVar19,iVar2);
      uVar11 = this->drag;
    }
    uVar14 = (ulong)local_90;
    uVar18 = iVar1 - local_90;
    uVar13 = -uVar18;
    if (0 < (int)uVar18) {
      uVar13 = uVar18;
    }
    if (uVar13 < 3) {
      this->dx = this->dx - uVar18;
      local_c0 = (ulong)((int)local_68 - ((int)(uVar11 << 0x1b) >> 0x1f & uVar18));
      draw_h_arrow(local_90,uVar10 + 5,0);
      uVar11 = this->drag;
      local_a8 = uVar14;
    }
    else {
      local_c0 = local_68;
    }
    iVar1 = ((this->super_Fl_Widget_Type).o)->w_;
    uVar18 = iVar1 - (local_90 + (int)local_c0);
    uVar13 = -uVar18;
    if (0 < (int)uVar18) {
      uVar13 = uVar18;
    }
    if (uVar13 < 3) {
      this->dx = this->dx + uVar18;
      iVar2 = uVar11 << 0x1b;
      uVar11 = (int)local_c0 + uVar18;
      local_c0 = (ulong)uVar11;
      draw_h_arrow(uVar11,uVar10 + 5,iVar1);
      uVar11 = this->drag;
      local_a8 = (ulong)((iVar2 >> 0x1f & uVar18) + (int)local_a8);
    }
  }
  pFVar17 = local_88;
  if ((this->numselected == 1) && (local_88 != (Fl_Widget_Type *)0x0)) {
    if ((uVar11 & 0x10) == 0) {
      local_98 = uVar9;
      newposition(local_40,local_88,(int *)&local_78,(int *)&local_94,&local_6c,&local_70);
      this = local_40;
      iVar1 = local_6c - local_78;
      iVar2 = local_70 - local_94;
      local_38 = iVar2;
      local_34 = iVar1;
      (*(pFVar17->super_Fl_Type)._vptr_Fl_Type[0x2d])();
      uVar9 = local_98;
      uVar11 = this->drag;
      if ((uVar11 & 0xc) != 0) {
        uVar18 = local_38 - iVar2;
        uVar13 = -uVar18;
        if (0 < (int)uVar18) {
          uVar13 = uVar18;
        }
        if (uVar13 < 5) {
          if ((uVar11 & 8) == 0) {
            local_70 = local_70 + uVar18;
            uVar19 = uVar19 + uVar18;
            iVar2 = uVar18 + this->dy;
          }
          else {
            local_94 = local_94 - uVar18;
            uVar10 = uVar10 - uVar18;
            iVar2 = this->dy - uVar18;
          }
          this->dy = iVar2;
        }
        iVar2 = local_78 + 10;
        if (0x31 < (int)local_78) {
          iVar2 = local_78 - 10;
        }
        draw_height(iVar2,local_94,local_70,(uint)((int)local_78 < 0x32) * 4 + 4);
        uVar11 = this->drag;
      }
      pFVar17 = local_88;
      if ((uVar11 & 3) != 0) {
        uVar18 = local_34 - iVar1;
        uVar13 = -uVar18;
        if (0 < (int)uVar18) {
          uVar13 = uVar18;
        }
        if (uVar13 < 5) {
          if ((uVar11 & 1) == 0) {
            local_6c = local_6c + uVar18;
            local_c0 = (ulong)((int)local_c0 + uVar18);
            iVar1 = uVar18 + this->dx;
          }
          else {
            local_78 = local_78 - uVar18;
            local_a8 = (ulong)((int)local_a8 - uVar18);
            iVar1 = this->dx - uVar18;
          }
          this->dx = iVar1;
        }
        iVar1 = local_94 + 10;
        if (0x31 < (int)local_94) {
          iVar1 = local_94 - 10;
        }
        draw_width(local_78,iVar1,local_6c,((int)local_94 < 0x32) + 1);
        uVar11 = this->drag;
      }
      goto LAB_0018bde7;
    }
LAB_0018bdef:
    iVar1 = (*(pFVar17->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar17);
    uVar13 = local_98;
    if (iVar1 != 0) {
      local_98 = uVar9;
      for (pFVar21 = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
          (pFVar21 != (Fl_Widget_Type *)0x0 &&
          (uVar13 = local_98,
          (this->super_Fl_Widget_Type).super_Fl_Type.level < (pFVar21->super_Fl_Type).level));
          pFVar21 = (Fl_Widget_Type *)(pFVar21->super_Fl_Type).next) {
        if ((pFVar21 != pFVar17) &&
           ((iVar1 = (*(pFVar21->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar21), iVar1 != 0 &&
            (iVar1 = Fl_Widget::visible_r(pFVar21->o), iVar1 != 0)))) {
          pFVar12 = pFVar21->o;
          local_54 = pFVar12->x_;
          iVar1 = pFVar12->y_;
          uVar11 = pFVar12->w_;
          uVar13 = pFVar12->h_ + iVar1;
          if (((pFVar12->label_).align_ & 0x10) == 0) {
            local_94 = (pFVar12->label_).size;
            local_78 = uVar11;
            Fl_Label::measure(&pFVar12->label_,(int *)&local_78,(int *)&local_94);
            pFVar12 = pFVar21->o;
            uVar9 = (pFVar12->label_).align_;
            iVar1 = iVar1 - (-(uVar9 & 1) & local_94);
            uVar13 = uVar13 + ((int)(uVar9 << 0x1e) >> 0x1f & local_94);
            uVar9 = local_98;
          }
          uVar11 = uVar11 + local_54;
          iVar2 = local_88->o->y_;
          uVar6 = iVar1 - (local_88->o->h_ + iVar2);
          uVar18 = -uVar6;
          if (0 < (int)uVar6) {
            uVar18 = uVar6;
          }
          uVar7 = iVar2 - uVar13;
          uVar6 = -uVar7;
          if (0 < (int)uVar7) {
            uVar6 = uVar7;
          }
          if (uVar18 < uVar6) {
            uVar6 = uVar18;
          }
          uVar18 = this->drag;
          if (uVar6 < 0x19) {
            if ((uVar18 & 0x11) != 0) {
              uVar7 = (int)local_a8 - local_54;
              uVar6 = -uVar7;
              if (0 < (int)uVar7) {
                uVar6 = uVar7;
              }
              if (uVar6 < 3) {
                this->dx = this->dx + uVar7;
                local_a8 = (ulong)((int)local_a8 + uVar7);
                local_c0 = (ulong)((int)local_c0 + ((int)(uVar18 << 0x1b) >> 0x1f & uVar7));
                draw_left_brace(pFVar12);
                uVar18 = this->drag;
              }
            }
            if ((uVar18 & 0x12) != 0) {
              uVar7 = uVar11 - (int)local_c0;
              uVar6 = -uVar7;
              if (0 < (int)uVar7) {
                uVar6 = uVar7;
              }
              if (uVar6 < 3) {
                this->dx = this->dx + uVar7;
                local_a8 = (ulong)((int)local_a8 + ((int)(uVar18 << 0x1b) >> 0x1f & uVar7));
                draw_right_brace(pFVar21->o);
                uVar18 = this->drag;
                local_c0 = (ulong)uVar11;
              }
            }
          }
          local_5c = iVar1;
          local_58 = uVar11;
          if ((uVar18 & 0x18) != 0) {
            uVar6 = uVar10 - iVar1;
            uVar11 = -uVar6;
            if (0 < (int)uVar6) {
              uVar11 = uVar6;
            }
            if (uVar11 < 3) {
              this->dy = this->dy + uVar6;
              uVar10 = uVar10 + uVar6;
              uVar19 = uVar19 + ((int)(uVar18 << 0x1b) >> 0x1f & uVar6);
              pFVar12 = pFVar21->o;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                        (fl_graphics_driver,(ulong)(uint)pFVar12->x_,(ulong)(pFVar12->y_ - 2),
                         (ulong)(pFVar12->y_ + 6));
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                        (fl_graphics_driver,(ulong)((pFVar12->x_ + pFVar12->w_) - 1),
                         (ulong)(pFVar12->y_ - 2),(ulong)(pFVar12->y_ + 6));
              this = local_40;
              iVar1 = local_5c;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                        (fl_graphics_driver,(ulong)(pFVar12->x_ - 2),(ulong)(uint)pFVar12->y_,
                         (ulong)(pFVar12->w_ + pFVar12->x_ + 1));
              uVar18 = this->drag;
            }
          }
          if ((uVar18 & 0x14) != 0) {
            uVar6 = uVar13 - uVar19;
            uVar11 = -uVar6;
            if (0 < (int)uVar6) {
              uVar11 = uVar6;
            }
            if (uVar11 < 3) {
              this->dy = this->dy + uVar6;
              uVar10 = uVar10 + ((int)(uVar18 << 0x1b) >> 0x1f & uVar6);
              pFVar12 = pFVar21->o;
              iVar2 = pFVar12->y_;
              iVar22 = pFVar12->h_;
              uVar11 = iVar22 + -7 + iVar2;
              uVar19 = iVar22 + 1 + iVar2;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                        (fl_graphics_driver,(ulong)(uint)pFVar12->x_,(ulong)uVar11,(ulong)uVar19);
              this = local_40;
              uVar9 = local_98;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                        (fl_graphics_driver,(ulong)((pFVar12->x_ + pFVar12->w_) - 1),(ulong)uVar11,
                         (ulong)uVar19);
              iVar1 = local_5c;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                        (fl_graphics_driver,(ulong)(pFVar12->x_ - 2),iVar22 + -1 + iVar2,
                         (ulong)(pFVar12->w_ + pFVar12->x_ + 1));
              uVar19 = uVar13;
            }
          }
          pFVar17 = local_88;
          iVar2 = (*(local_88->super_Fl_Type)._vptr_Fl_Type[0x20])(local_88);
          if (iVar2 == 0) {
            pFVar17 = pFVar21;
          }
          (*(pFVar17->super_Fl_Type)._vptr_Fl_Type[0x2e])(pFVar17,&local_90,&local_9c);
          pFVar17 = local_88;
          if (((int)uVar10 <= (int)uVar13) && (iVar1 <= (int)uVar19)) {
            uVar11 = this->drag;
            if ((uVar11 & 0x11) != 0) {
              iVar1 = local_54 - (int)local_a8;
              uVar6 = iVar1 - local_90;
              uVar18 = -uVar6;
              if (0 < (int)uVar6) {
                uVar18 = uVar6;
              }
              uVar7 = iVar1 + local_90;
              if (uVar18 < 3) {
                uVar7 = uVar6;
              }
              uVar18 = -uVar7;
              if (0 < (int)uVar7) {
                uVar18 = uVar7;
              }
              if (uVar18 < 3) {
                this->dx = this->dx + uVar7;
                uVar18 = (int)local_a8 + uVar7;
                local_a8 = (ulong)uVar18;
                local_c0 = (ulong)((int)local_c0 + ((int)(uVar11 << 0x1b) >> 0x1f & uVar7));
                draw_h_arrow(uVar18,(int)(uVar10 + uVar19) / 2,local_54);
                uVar11 = this->drag;
              }
              iVar1 = local_58 - (int)local_a8;
              uVar6 = iVar1 - local_90;
              uVar18 = -uVar6;
              if (0 < (int)uVar6) {
                uVar18 = uVar6;
              }
              uVar7 = iVar1 + local_90;
              if (uVar18 < 3) {
                uVar7 = uVar6;
              }
              uVar18 = -uVar7;
              if (0 < (int)uVar7) {
                uVar18 = uVar7;
              }
              if (uVar18 < 3) {
                this->dx = this->dx + uVar7;
                uVar18 = (int)local_a8 + uVar7;
                local_a8 = (ulong)uVar18;
                local_c0 = (ulong)((int)local_c0 + ((int)(uVar11 << 0x1b) >> 0x1f & uVar7));
                draw_h_arrow(uVar18,(int)(uVar10 + uVar19) / 2,local_58);
                uVar11 = this->drag;
              }
            }
            pFVar17 = local_88;
            if ((uVar11 & 0x12) != 0) {
              uVar6 = (local_54 - (int)local_c0) - local_90;
              uVar18 = -uVar6;
              if (0 < (int)uVar6) {
                uVar18 = uVar6;
              }
              uVar7 = (local_54 - (int)local_c0) + local_90;
              if (uVar18 < 3) {
                uVar7 = uVar6;
              }
              uVar18 = -uVar7;
              if (0 < (int)uVar7) {
                uVar18 = uVar7;
              }
              if (uVar18 < 3) {
                this->dx = this->dx + uVar7;
                local_a8 = (ulong)((int)local_a8 + ((int)(uVar11 << 0x1b) >> 0x1f & uVar7));
                uVar7 = (int)local_c0 + uVar7;
                local_c0 = (ulong)uVar7;
                draw_h_arrow(uVar7,(int)(uVar10 + uVar19) / 2,local_54);
              }
              uVar11 = local_90 + (local_58 - (int)local_c0);
              uVar18 = -uVar11;
              if (0 < (int)uVar11) {
                uVar18 = uVar11;
              }
              uVar6 = (local_58 - (int)local_c0) - local_90;
              if (uVar18 < 3) {
                uVar6 = uVar11;
              }
              uVar11 = -uVar6;
              if (0 < (int)uVar6) {
                uVar11 = uVar6;
              }
              if (uVar11 < 3) {
                this->dx = this->dx + uVar6;
                local_a8 = (ulong)((int)local_a8 + ((this->drag << 0x1b) >> 0x1f & uVar6));
                uVar6 = (int)local_c0 + uVar6;
                local_c0 = (ulong)uVar6;
                draw_h_arrow(uVar6,(int)(uVar10 + uVar19) / 2,local_58);
              }
            }
          }
          if (((int)local_a8 <= (int)local_58) && (local_54 <= (int)local_c0)) {
            uVar11 = this->drag;
            if ((uVar11 & 0x18) != 0) {
              uVar6 = (local_5c - uVar10) - local_9c;
              uVar18 = -uVar6;
              if (0 < (int)uVar6) {
                uVar18 = uVar6;
              }
              uVar7 = (local_5c - uVar10) + local_9c;
              if (uVar18 < 3) {
                uVar7 = uVar6;
              }
              uVar18 = -uVar7;
              if (0 < (int)uVar7) {
                uVar18 = uVar7;
              }
              if (uVar18 < 3) {
                this->dy = this->dy + uVar7;
                uVar10 = uVar10 + uVar7;
                uVar19 = ((int)(uVar11 << 0x1b) >> 0x1f & uVar7) + uVar19;
                draw_v_arrow(((int)local_a8 + (int)local_c0) / 2,uVar10,local_5c);
                uVar11 = this->drag;
              }
              uVar6 = (uVar13 - uVar10) - local_9c;
              uVar18 = -uVar6;
              if (0 < (int)uVar6) {
                uVar18 = uVar6;
              }
              uVar7 = (uVar13 - uVar10) + local_9c;
              if (uVar18 < 3) {
                uVar7 = uVar6;
              }
              uVar18 = -uVar7;
              if (0 < (int)uVar7) {
                uVar18 = uVar7;
              }
              if (uVar18 < 3) {
                this->dy = this->dy + uVar7;
                uVar10 = uVar10 + uVar7;
                uVar19 = ((int)(uVar11 << 0x1b) >> 0x1f & uVar7) + uVar19;
                draw_v_arrow(((int)local_a8 + (int)local_c0) / 2,uVar10,uVar13);
                uVar11 = this->drag;
              }
            }
            pFVar17 = local_88;
            if ((uVar11 & 0x14) != 0) {
              uVar6 = (local_5c - uVar19) - local_9c;
              uVar18 = -uVar6;
              if (0 < (int)uVar6) {
                uVar18 = uVar6;
              }
              uVar7 = (local_5c - uVar19) + local_9c;
              if (uVar18 < 3) {
                uVar7 = uVar6;
              }
              uVar18 = -uVar7;
              if (0 < (int)uVar7) {
                uVar18 = uVar7;
              }
              if (uVar18 < 3) {
                this->dy = this->dy + uVar7;
                uVar10 = ((int)(uVar11 << 0x1b) >> 0x1f & uVar7) + uVar10;
                uVar19 = uVar19 + uVar7;
                draw_v_arrow(((int)local_a8 + (int)local_c0) / 2,uVar19,local_5c);
              }
              uVar18 = (uVar13 - uVar19) - local_9c;
              uVar11 = -uVar18;
              if (0 < (int)uVar18) {
                uVar11 = uVar18;
              }
              uVar6 = (uVar13 - uVar19) + local_9c;
              if (uVar11 < 3) {
                uVar6 = uVar18;
              }
              uVar11 = -uVar6;
              if (0 < (int)uVar6) {
                uVar11 = uVar6;
              }
              pFVar17 = local_88;
              if (uVar11 < 3) {
                this->dy = this->dy + uVar6;
                uVar10 = ((this->drag << 0x1b) >> 0x1f & uVar6) + uVar10;
                uVar19 = uVar19 + uVar6;
                draw_v_arrow(((int)local_a8 + (int)local_c0) / 2,uVar19,uVar13);
                pFVar17 = local_88;
              }
            }
          }
        }
        uVar13 = local_98;
      }
    }
  }
  else {
LAB_0018bde7:
    uVar13 = local_98;
    if (uVar11 != 0) goto LAB_0018bdef;
  }
  local_98 = uVar13;
  uVar11 = (local_7c - (int)local_50) + (int)local_a8;
  local_c0._0_4_ = ((int)local_48 - (int)local_68) + (int)local_c0;
  uVar9 = (uVar9 - local_8c) + uVar10;
  local_50 = local_a8;
  uVar16 = (local_74 - uVar16) + uVar19;
  local_8c = uVar10;
LAB_0018c643:
  uVar14 = (ulong)uVar9;
  this->sx = uVar11;
  this->sy = uVar9;
  this->sr = (int)local_c0;
  this->st = uVar16;
  local_7c = uVar11;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,2,0,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,0,0,0);
  uVar11 = local_7c;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
            (fl_graphics_driver,(ulong)local_7c,uVar14,(ulong)((int)local_c0 - local_7c),
             (ulong)(uVar16 - uVar9));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)uVar11,uVar14,5,5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)((int)local_c0 - 5U),uVar14,5,5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)((int)local_c0 - 5U),(ulong)(uVar16 - 5),5,5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)uVar11,(ulong)(uVar16 - 5),5,5);
  return;
}

Assistant:

void Fl_Window_Type::draw_overlay() {
  if (recalc) {
    bx = o->w(); by = o->h(); br = 0; bt = 0;
    numselected = 0;
    for (Fl_Type *q=next; q && q->level>level; q=q->next)
      if (q->selected && q->is_widget() && !q->is_menu_item()) {
	numselected++;
	Fl_Widget_Type* myo = (Fl_Widget_Type*)q;
	if (myo->o->x() < bx) bx = myo->o->x();
	if (myo->o->y() < by) by = myo->o->y();
	if (myo->o->x()+myo->o->w() > br) br = myo->o->x()+myo->o->w();
	if (myo->o->y()+myo->o->h() > bt) bt = myo->o->y()+myo->o->h();
      }
    recalc = 0;
    sx = bx; sy = by; sr = br; st = bt;
  }
  fl_color(FL_RED);
  if (drag==BOX && (x1 != mx || y1 != my)) {
    int x = x1; int r = mx; if (x > r) {x = mx; r = x1;}
    int y = y1; int b = my; if (y > b) {y = my; b = y1;}
    fl_rect(x,y,r-x,b-y);
  }
  if (overlays_invisible && !drag) return;
  if (selected) fl_rect(0,0,o->w(),o->h());
  if (!numselected) return;
  int mybx,myby,mybr,mybt;
  int mysx,mysy,mysr,myst;
  mybx = mysx = o->w(); myby = mysy = o->h(); mybr = mysr = 0; mybt = myst = 0;
  Fl_Type *selection = 0L; // used to store the one selected widget (if n==1)
  for (Fl_Type *q=next; q && q->level>level; q = q->next)
    if (q->selected && q->is_widget() && !q->is_menu_item()) {
      selection = q;
      Fl_Widget_Type* myo = (Fl_Widget_Type*)q;
      int x,y,r,t;
      newposition(myo,x,y,r,t);
      if (!show_guides || !drag || numselected != 1) fl_rect(x,y,r-x,t-y);
      if (x < mysx) mysx = x;
      if (y < mysy) mysy = y;
      if (r > mysr) mysr = r;
      if (t > myst) myst = t;
      if (!(myo->o->align() & FL_ALIGN_INSIDE)) {
        // Adjust left/right/top/bottom for top/bottom labels...
	int ww, hh;
	ww = (myo->o->align() & FL_ALIGN_WRAP) ? myo->o->w() : 0;
	hh = myo->o->labelsize();
	myo->o->measure_label(ww, hh);
	if (myo->o->align() & FL_ALIGN_TOP) y -= hh;
	else if (myo->o->align() & FL_ALIGN_BOTTOM) t += hh;
	else if (myo->o->align() & FL_ALIGN_LEFT) x -= ww + 4;
	else if (myo->o->align() & FL_ALIGN_RIGHT) r += ww + 4;
      }
      if (x < mybx) mybx = x;
      if (y < myby) myby = y;
      if (r > mybr) mybr = r;
      if (t > mybt) mybt = t;
    }
  if (selected) return;

  if (show_guides && drag) {
    // draw overlays for UI Guideline distances
    // - check for distance to the window edge
    //    * FLTK suggests 10 pixels from the edge
    int d;
    int xsp, ysp;
    int mybx_bak = mybx, myby_bak = myby, mybr_bak = mybr, mybt_bak = mybt;
    Fl_Widget_Type *mysel = (Fl_Widget_Type *)selection;


    ideal_spacing(xsp, ysp);

    if (drag) {
      // Check top spacing...
      if (abs(d = myby - ysp) < 3) {
	dy -= d;
	if (drag & DRAG) mybt -= d;
	myby -= d;
	draw_v_arrow(mybx+5, myby, 0);
      }

      // Check bottom spacing...
      if (abs(d = o->h() - mybt - ysp) < 3) {
	dy += d;
	if (drag & DRAG) myby += d;
	mybt += d;
	draw_v_arrow(mybx+5, mybt, o->h());
      }

      // Check left spacing...
      if (abs(d = mybx - xsp) < 3) {
        dx -= d;
	if (drag & DRAG) mybr -= d;
	mybx -= d;
	draw_h_arrow(mybx, myby+5, 0);
      }

      // Check right spacing...
      if (abs(d = o->w() - mybr - xsp) < 3) {
	dx += d;
	if (drag & DRAG) mybx += d;
	mybr += d;
	draw_h_arrow(mybr, myby+5, o->w());
      }
    }

    if (numselected==1 && selection && !(drag & DRAG)) {
      // Check ideal sizes
      int x,y,r,t;
      newposition(mysel,x,y,r,t);
      int w = r-x;
      int h = t-y;
      int iw = w, ih = h;

      mysel->ideal_size(iw, ih);

      if (drag & (TOP | BOTTOM)) {
	// Check height
	if (abs(d = ih - h) < 5) {
          // Resize height
	  if (drag & TOP) {
	    myby -= d;
	    y -= d;
	    dy -= d;
	  } else {
	    mybt += d;
	    t += d;
	    dy += d;
	  }
	}

	// Draw height guide
	draw_height(x < 50 ? x+10 : x-10, y, t,
	            x < 50 ? FL_ALIGN_RIGHT : FL_ALIGN_LEFT);
      }

      if (drag & (LEFT | RIGHT)) {
	// Check width
	if (abs(d = iw - w) < 5) {
          // Resize width
          if (drag & LEFT) {
	    mybx -= d;
	    x -= d;
	    dx -= d;
	  } else {
	    mybr += d;
	    r += d;
	    dx += d;
	  }
	}

	// Draw width guide
	draw_width(x, y < 50 ? y+10 : y-10, r,
	           y < 50 ? FL_ALIGN_BOTTOM : FL_ALIGN_TOP);
      }
    }

    // Check spacing and alignment between individual widgets
    if (drag && selection->is_widget()) {
      for (Fl_Type *q=next; q && q->level>level; q = q->next)
	if (q != selection && q->is_widget()) {
          Fl_Widget_Type *qw = (Fl_Widget_Type*)q;
          // Only check visible widgets...
	  if (!qw->o->visible_r()) continue;

          // Get bounding box of widget...
	  int qx = qw->o->x();
	  int qr = qw->o->x() + qw->o->w();
	  int qy = qw->o->y();
	  int qt = qw->o->y() + qw->o->h();

	  if (!(qw->o->align() & FL_ALIGN_INSIDE)) {
            // Adjust top/bottom for top/bottom labels...
	    int ww, hh;
	    ww = qw->o->w();
	    hh = qw->o->labelsize();
	    qw->o->measure_label(ww, hh);
	    if (qw->o->align() & FL_ALIGN_TOP) qy -= hh;
	    if (qw->o->align() & FL_ALIGN_BOTTOM) qt += hh;
	  }

          // Do horizontal alignment when the widget is within 25
	  // pixels vertically...
	  if (fl_min(abs(qy - mysel->o->y() - mysel->o->h()),
	             abs(mysel->o->y() - qt)) < 25) {
            // Align to left of other widget...
            if ((drag & (LEFT | DRAG)) && abs(d = mybx - qx) < 3) {
	      dx += d;
              mybx += d;
	      if (drag & DRAG) mybr += d;

	      draw_left_brace(qw->o);
	    }

            // Align to right of other widget...
            if ((drag & (RIGHT | DRAG)) &&
	        abs(d = qr - mybr) < 3) {
	      dx += d;
              if (drag & DRAG) mybx += d;
	      mybr += d;

	      draw_right_brace(qw->o);
	    }
          }

          // Align to top of other widget...
          if ((drag & (TOP | DRAG)) && abs(d = myby - qy) < 3) {
	    dy += d;
            myby += d;
	    if (drag & DRAG) mybt += d;

	    draw_top_brace(qw->o);
	  }

          // Align to bottom of other widget...
          if ((drag & (BOTTOM | DRAG)) && abs(d = qt - mybt) < 3) {
	    dy += d;
            if (drag & DRAG) myby += d;
	    mybt += d;

	    draw_bottom_brace(qw->o);
	  }

          // Check spacing between widgets
	  if (mysel->is_group()) mysel->ideal_spacing(xsp, ysp);
          else qw->ideal_spacing(xsp, ysp);

          if ((qt)>=myby && qy<=mybt) {
            if (drag & (LEFT | DRAG)) {
	      // Compare left of selected to left of current
	      if (abs(d = qx - mybx - xsp) >= 3)
	        d = qx - mybx + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	mybx += d;
		if (drag & DRAG) mybr += d;

        	// Draw left arrow
		draw_h_arrow(mybx, (myby+mybt)/2, qx);
              }

	      // Compare left of selected to right of current
              if (abs(d = qr - mybx - xsp) >= 3)
	        d = qr - mybx + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	mybx += d;
		if (drag & DRAG) mybr += d;

        	// Draw left arrow
		draw_h_arrow(mybx, (myby+mybt)/2, qr);
              }
	    }

            if (drag & (RIGHT | DRAG)) {
	      // Compare right of selected to left of current
	      if (abs(d = qx - mybr - xsp) >= 3)
	        d = qx - mybr + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	if (drag & DRAG) mybx += d;
		mybr += d;

        	// Draw right arrow
		draw_h_arrow(mybr, (myby+mybt)/2, qx);
              }

	      // Compare right of selected to right of current
              if (abs(d = qr - mybr + xsp) >= 3)
	        d = qr - mybr - xsp;

              if (abs(d) < 3) {
		dx += d;
        	if (drag & DRAG) mybx += d;
		mybr += d;

        	// Draw right arrow
		draw_h_arrow(mybr, (myby+mybt)/2, qr);
              }
            }
	  }

          if (qr>=mybx && qx<=mybr) {
            // Compare top of selected to top of current
            if (drag & (TOP | DRAG)) {
	      if (abs(d = qy - myby - ysp) >= 3)
	        d = qy - myby + ysp;

	      if (abs(d) < 3) {
		dy += d;
		myby += d;
		if (drag & DRAG) mybt += d;

		// Draw up arrow...
		draw_v_arrow((mybx+mybr)/2, myby, qy);
              }

              // Compare top of selected to bottom of current
              if (abs(d = qt - myby - ysp) >= 3)
                d = qt - myby + ysp;

              if (abs(d) < 3) {
		dy += d;
		myby += d;
		if (drag & DRAG) mybt += d;

		// Draw up arrow...
		draw_v_arrow((mybx+mybr)/2, myby, qt);
              }
	    }

	    // Compare bottom of selected to top of current
            if (drag & (BOTTOM | DRAG)) {
	      if (abs(d = qy - mybt - ysp) >= 3)
	        d = qy - mybt + ysp;

	      if (abs(d) < 3) {
		dy += d;
		if (drag & DRAG) myby += d;
		mybt += d;

		// Draw down arrow...
		draw_v_arrow((mybx+mybr)/2, mybt, qy);
              }

	      // Compare bottom of selected to bottom of current
              if (abs(d = qt - mybt - ysp) >= 3)
                d = qt - mybt + ysp;

              if (abs(d) < 3) {
		dy += d;
		if (drag & DRAG) myby += d;
		mybt += d;

		// Draw down arrow...
		draw_v_arrow((mybx+mybr)/2, mybt, qt);
              }
	    }
          }
	}
    }
    mysx += mybx-mybx_bak; mysr += mybr-mybr_bak;
    mysy += myby-myby_bak; myst += mybt-mybt_bak;
  }
  // align the snapping selection box with the box we draw.
  sx = mysx; sy = mysy; sr = mysr; st = myst;

  // Draw selection box + resize handles...
  // draw box including all labels
  fl_line_style(FL_DOT);
  fl_rect(mybx,myby,mybr-mybx,mybt-myby);
  fl_line_style(FL_SOLID);
  // draw box excluding labels
  fl_rect(mysx,mysy,mysr-mysx,myst-mysy);
  fl_rectf(mysx,mysy,5,5);
  fl_rectf(mysr-5,mysy,5,5);
  fl_rectf(mysr-5,myst-5,5,5);
  fl_rectf(mysx,myst-5,5,5);
}